

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSOSRWHandler * find_rh(JSThreadState *ts,int fd)

{
  list_head *el;
  JSOSRWHandler *rh;
  int fd_local;
  JSThreadState *ts_local;
  
  el = (ts->os_rw_handlers).next;
  while( true ) {
    if ((JSThreadState *)el == ts) {
      return (JSOSRWHandler *)0x0;
    }
    if (*(int *)&el[1].prev == fd) break;
    el = el->next;
  }
  return (JSOSRWHandler *)el;
}

Assistant:

static JSOSRWHandler *find_rh(JSThreadState *ts, int fd)
{
    JSOSRWHandler *rh;
    struct list_head *el;

    list_for_each(el, &ts->os_rw_handlers) {
        rh = list_entry(el, JSOSRWHandler, link);
        if (rh->fd == fd)
            return rh;
    }
    return NULL;
}